

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::DockNodeUpdateWindowMenu(ImGuiDockNode *node,ImGuiTabBar *tab_bar)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  char *label;
  float fVar6;
  float fVar7;
  ImVec2 local_58;
  ImGuiTabItem *local_50;
  ImGuiTabItem *tab;
  int tab_n;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c;
  ImGuiID local_24;
  ImGuiContext *pIStack_20;
  ImGuiID ret_tab_id;
  ImGuiContext *g;
  ImGuiTabBar *tab_bar_local;
  ImGuiDockNode *node_local;
  
  pIStack_20 = GImGui;
  local_24 = 0;
  g = (ImGuiContext *)tab_bar;
  tab_bar_local = (ImGuiTabBar *)node;
  if ((GImGui->Style).WindowMenuButtonPosition == 0) {
    fVar1 = (node->Pos).x;
    fVar2 = (node->Pos).y;
    fVar6 = GetFrameHeight();
    ImVec2::ImVec2(&local_2c,fVar1,fVar2 + fVar6);
    ImVec2::ImVec2(&local_34,0.0,0.0);
    SetNextWindowPos(&local_2c,1,&local_34);
  }
  else {
    fVar1 = (node->Pos).x;
    fVar2 = (node->Size).x;
    fVar6 = (node->Pos).y;
    fVar7 = GetFrameHeight();
    ImVec2::ImVec2(&local_3c,fVar1 + fVar2,fVar6 + fVar7);
    ImVec2::ImVec2((ImVec2 *)((long)&tab + 4),1.0,0.0);
    SetNextWindowPos(&local_3c,1,(ImVec2 *)((long)&tab + 4));
  }
  bVar5 = BeginPopup("#WindowMenu",0);
  if (bVar5) {
    *(ushort *)&tab_bar_local[1].CurrFrameVisible =
         (ushort)tab_bar_local[1].CurrFrameVisible & 0xfbff | 0x400;
    iVar4._0_1_ = g->Initialized;
    iVar4._1_1_ = g->FontAtlasOwnedByContext;
    iVar4._2_2_ = *(undefined2 *)&g->field_0x2;
    if (iVar4 == 1) {
      bVar5 = ImGuiDockNode::IsHiddenTabBar((ImGuiDockNode *)tab_bar_local);
      bVar5 = MenuItem("Hide tab bar",(char *)0x0,bVar5,true);
      if (bVar5) {
        *(byte *)((long)&tab_bar_local[1].CurrFrameVisible + 2) =
             *(byte *)((long)&tab_bar_local[1].CurrFrameVisible + 2) & 0xfb | 4;
      }
    }
    else {
      for (tab._0_4_ = 0; iVar3._0_1_ = g->Initialized, iVar3._1_1_ = g->FontAtlasOwnedByContext,
          iVar3._2_2_ = *(undefined2 *)&g->field_0x2, (int)tab < iVar3; tab._0_4_ = (int)tab + 1) {
        local_50 = ImVector<ImGuiTabItem>::operator[]((ImVector<ImGuiTabItem> *)g,(int)tab);
        if ((local_50->Flags & 0x200000U) == 0) {
          label = ImGuiTabBar::GetTabName((ImGuiTabBar *)g,local_50);
          fVar2 = (float)local_50->ID;
          fVar1 = (g->IO).DeltaTime;
          ImVec2::ImVec2(&local_58,0.0,0.0);
          bVar5 = Selectable(label,fVar2 == fVar1,0,&local_58);
          if (bVar5) {
            local_24 = local_50->ID;
          }
          SameLine(0.0,-1.0);
          Text("   ");
        }
      }
    }
    EndPopup();
  }
  return local_24;
}

Assistant:

static ImGuiID ImGui::DockNodeUpdateWindowMenu(ImGuiDockNode* node, ImGuiTabBar* tab_bar)
{
    // Try to position the menu so it is more likely to stays within the same viewport
    ImGuiContext& g = *GImGui;
    ImGuiID ret_tab_id = 0;
    if (g.Style.WindowMenuButtonPosition == ImGuiDir_Left)
        SetNextWindowPos(ImVec2(node->Pos.x, node->Pos.y + GetFrameHeight()), ImGuiCond_Always, ImVec2(0.0f, 0.0f));
    else
        SetNextWindowPos(ImVec2(node->Pos.x + node->Size.x, node->Pos.y + GetFrameHeight()), ImGuiCond_Always, ImVec2(1.0f, 0.0f));
    if (BeginPopup("#WindowMenu"))
    {
        node->IsFocused = true;
        if (tab_bar->Tabs.Size == 1)
        {
            if (MenuItem("Hide tab bar", NULL, node->IsHiddenTabBar()))
                node->WantHiddenTabBarToggle = true;
        }
        else
        {
            for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            {
                ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                if (tab->Flags & ImGuiTabItemFlags_Button)
                    continue;
                if (Selectable(tab_bar->GetTabName(tab), tab->ID == tab_bar->SelectedTabId))
                    ret_tab_id = tab->ID;
                SameLine();
                Text("   ");
            }
        }
        EndPopup();
    }
    return ret_tab_id;
}